

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O2

void * unpack_new(t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  undefined4 uVar2;
  t_object *owner;
  _gobj *p_Var3;
  _outlet *p_Var4;
  t_symbol *s_00;
  long lVar5;
  bool bVar6;
  t_atom defarg [2];
  
  owner = (t_object *)pd_new(unpack_class);
  if (argc == 0) {
    defarg[0].a_type = A_FLOAT;
    defarg[0].a_w.w_float = 0.0;
    defarg[1].a_w.w_float = 0.0;
    argc = 2;
    argv = defarg;
    defarg[1].a_type = defarg[0].a_type;
  }
  owner[1].te_g.g_pd = (t_pd)(long)argc;
  p_Var3 = (_gobj *)getbytes((long)argc << 4);
  owner[1].te_g.g_next = p_Var3;
  if (argc < 1) {
    argc = 0;
  }
  lVar5 = 0;
  do {
    bVar6 = argc == 0;
    argc = argc + -1;
    if (bVar6) {
      return owner;
    }
    uVar2 = 1;
    s_00 = &s_float;
    if (*(int *)((long)&argv->a_type + lVar5) == 2) {
      cVar1 = *(char *)**(undefined8 **)((long)&argv->a_w + lVar5);
      if (cVar1 == 'f') {
LAB_001772ad:
        uVar2 = 1;
        s_00 = &s_float;
      }
      else {
        uVar2 = 2;
        s_00 = &s_symbol;
        if (cVar1 != 's') {
          if (cVar1 != 'p') {
            pd_error(owner,"unpack: %s: bad type");
            goto LAB_001772ad;
          }
          uVar2 = 3;
          s_00 = &s_pointer;
        }
      }
    }
    *(undefined4 *)((long)&p_Var3->g_pd + lVar5) = uVar2;
    p_Var4 = outlet_new(owner,s_00);
    *(_outlet **)((long)&p_Var3->g_next + lVar5) = p_Var4;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

static void *unpack_new(t_symbol *s, int argc, t_atom *argv)
{
    t_unpack *x = (t_unpack *)pd_new(unpack_class);
    t_atom defarg[2], *ap;
    t_unpackout *u;
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 0);
        SETFLOAT(&defarg[1], 0);
    }
    x->x_n = argc;
    x->x_vec = (t_unpackout *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0, ap = argv, u = x->x_vec; i < argc; u++, ap++, i++)
    {
        t_atomtype type = ap->a_type;
        if (type == A_SYMBOL)
        {
            char c = *ap->a_w.w_symbol->s_name;
            if (c == 's')
            {
                u->u_type = A_SYMBOL;
                u->u_outlet = outlet_new(&x->x_obj, &s_symbol);
            }
            else if (c == 'p')
            {
                u->u_type =  A_POINTER;
                u->u_outlet = outlet_new(&x->x_obj, &s_pointer);
            }
            else
            {
                if (c != 'f') pd_error(x, "unpack: %s: bad type",
                    ap->a_w.w_symbol->s_name);
                u->u_type = A_FLOAT;
                u->u_outlet = outlet_new(&x->x_obj, &s_float);
            }
        }
        else
        {
            u->u_type =  A_FLOAT;
            u->u_outlet = outlet_new(&x->x_obj, &s_float);
        }
    }
    return (x);
}